

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

string_view __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpBase::GetSymbolName
          (BinaryReaderObjdumpBase *this,Index symbol_index)

{
  size_type sVar1;
  reference pvVar2;
  ObjdumpSymbol *sym;
  Index symbol_index_local;
  BinaryReaderObjdumpBase *this_local;
  
  sVar1 = std::vector<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>::size
                    (&this->objdump_state_->symtab);
  if (symbol_index < sVar1) {
    pvVar2 = std::vector<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>::operator[]
                       (&this->objdump_state_->symtab,(ulong)symbol_index);
    switch(pvVar2->kind) {
    case Function:
      _this_local = GetFunctionName(this,pvVar2->index);
      break;
    case Data:
      _this_local = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&pvVar2->name);
      break;
    case Global:
      _this_local = GetGlobalName(this,pvVar2->index);
      break;
    case Section:
      _this_local = GetSectionName(this,pvVar2->index);
      break;
    case Tag:
      _this_local = GetTagName(this,pvVar2->index);
      break;
    case Table:
      _this_local = GetTableName(this,pvVar2->index);
      break;
    default:
      abort();
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               "<illegal_symbol_index>");
  }
  return _this_local;
}

Assistant:

std::string_view BinaryReaderObjdumpBase::GetSymbolName(
    Index symbol_index) const {
  if (symbol_index >= objdump_state_->symtab.size())
    return "<illegal_symbol_index>";
  ObjdumpSymbol& sym = objdump_state_->symtab[symbol_index];
  switch (sym.kind) {
    case SymbolType::Function:
      return GetFunctionName(sym.index);
    case SymbolType::Data:
      return sym.name;
    case SymbolType::Global:
      return GetGlobalName(sym.index);
    case SymbolType::Section:
      return GetSectionName(sym.index);
    case SymbolType::Tag:
      return GetTagName(sym.index);
    case SymbolType::Table:
      return GetTableName(sym.index);
  }
  WABT_UNREACHABLE;
}